

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2.hpp
# Opt level: O3

void crypto::hmac<crypto::iterated_hash<crypto::sha256_transform>_>::prepare_state
               (char *password,size_t length,hash_word *istate,hash_word *ostate)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  char ikey [64];
  char okey [64];
  uint local_d8 [16];
  undefined1 local_98 [96];
  undefined8 local_38;
  
  if (length < 0x41) {
    memcpy(local_d8,password,length);
  }
  else {
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    sha256_transform::init((EVP_PKEY_CTX *)(local_98 + 0x40));
    iterated_hash<crypto::sha256_transform>::update
              ((iterated_hash<crypto::sha256_transform> *)local_98,password,length);
    iterated_hash<crypto::sha256_transform>::finalize
              ((iterated_hash<crypto::sha256_transform> *)local_98,(char *)local_d8);
    length = 0x20;
  }
  lVar5 = 0;
  memset((void *)((long)local_d8 + length),0,0x40 - length);
  do {
    uVar1 = *(uint *)((long)local_d8 + lVar5);
    uVar2 = *(uint *)((long)local_d8 + lVar5 + 4);
    uVar3 = *(uint *)((long)local_d8 + lVar5 + 8);
    uVar4 = *(uint *)((long)local_d8 + lVar5 + 0xc);
    *(uint *)(local_98 + lVar5) = uVar1 ^ 0x5c5c5c5c;
    *(uint *)(local_98 + lVar5 + 4) = uVar2 ^ 0x5c5c5c5c;
    *(uint *)(local_98 + lVar5 + 8) = uVar3 ^ 0x5c5c5c5c;
    *(uint *)(local_98 + lVar5 + 0xc) = uVar4 ^ 0x5c5c5c5c;
    *(uint *)((long)local_d8 + lVar5) = uVar1 ^ 0x36363636;
    *(uint *)((long)local_d8 + lVar5 + 4) = uVar2 ^ 0x36363636;
    *(uint *)((long)local_d8 + lVar5 + 8) = uVar3 ^ 0x36363636;
    *(uint *)((long)local_d8 + lVar5 + 0xc) = uVar4 ^ 0x36363636;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  iterated_hash<crypto::sha256_transform>::prepare_state((char *)local_d8,1,istate);
  iterated_hash<crypto::sha256_transform>::prepare_state(local_98,1,ostate);
  return;
}

Assistant:

static void prepare_state(const char * password, size_t length, state_t istate, state_t ostate) {
		
		char ikey[block_size], okey[block_size];
		if(length > block_size) {
			T hash;
			hash.init();
			hash.update(password, length);
			hash.finalize(ikey);
			length = hash_size;
		} else {
			std::memcpy(ikey, password, length);
		}
		std::memset(ikey + length, 0, block_size - length);
		
		for(size_t i = 0; i < block_size; i++) {
			okey[i] = char(boost::uint8_t(ikey[i]) ^ boost::uint8_t(0x5c));
			ikey[i] = char(boost::uint8_t(ikey[i]) ^ boost::uint8_t(0x36));
		}
		
		T::prepare_state(ikey, 1, istate);
		T::prepare_state(okey, 1, ostate);
		
	}